

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O1

bool __thiscall
cmSubdirCommand::InitialPass
          (cmSubdirCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  undefined8 uVar7;
  string *psVar8;
  long *plVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  ulong uVar12;
  pointer inName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string srcPath;
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  string local_a0;
  undefined4 local_7c;
  string local_78;
  undefined8 local_58;
  string local_50;
  
  inName = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (inName == pbVar2) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    bVar5 = 0;
  }
  else {
    paVar1 = &local_a0.field_2;
    local_7c = (undefined4)CONCAT71((int7)((ulong)&local_78.field_2 >> 8),1);
    local_58 = 0;
    do {
      uVar7 = std::__cxx11::string::compare((char *)inName);
      if ((int)uVar7 == 0) {
        local_58 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)inName);
        if (iVar6 != 0) {
          psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                             ((this->super_cmCommand).Makefile);
          pcVar3 = (psVar8->_M_dataplus)._M_p;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,pcVar3,pcVar3 + psVar8->_M_string_length);
          std::__cxx11::string::append((char *)&local_a0);
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_a0,(ulong)(inName->_M_dataplus)._M_p);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          psVar11 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_78.field_2._M_allocated_capacity = *psVar11;
            local_78.field_2._8_8_ = plVar9[3];
          }
          else {
            local_78.field_2._M_allocated_capacity = *psVar11;
            local_78._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_78._M_string_length = plVar9[1];
          *plVar9 = (long)psVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          bVar4 = cmsys::SystemTools::FileIsDirectory(&local_78);
          if (bVar4) {
            psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                               ((this->super_cmCommand).Makefile);
            local_c0 = local_b0;
            pcVar3 = (psVar8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,pcVar3,pcVar3 + psVar8->_M_string_length);
            std::__cxx11::string::append((char *)&local_c0);
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_c0,(ulong)(inName->_M_dataplus)._M_p);
            psVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_a0.field_2._M_allocated_capacity = *psVar11;
              local_a0.field_2._8_8_ = puVar10[3];
              local_a0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar11;
              local_a0._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_a0._M_string_length = puVar10[1];
            *puVar10 = psVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            if (local_c0 != local_b0) {
              operator_delete(local_c0,local_b0[0] + 1);
            }
            cmMakefile::AddSubDirectory
                      ((this->super_cmCommand).Makefile,&local_78,&local_a0,
                       (bool)((byte)local_58 & 1),false);
LAB_0028d003:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar4 = cmsys::SystemTools::FileIsDirectory(inName);
            if (bVar4) {
              psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                                 ((this->super_cmCommand).Makefile);
              local_c0 = local_b0;
              pcVar3 = (psVar8->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c0,pcVar3,pcVar3 + psVar8->_M_string_length);
              std::__cxx11::string::append((char *)&local_c0);
              cmsys::SystemTools::GetFilenameName(&local_50,inName);
              uVar12 = 0xf;
              if (local_c0 != local_b0) {
                uVar12 = local_b0[0];
              }
              if (uVar12 < local_50._M_string_length + local_b8) {
                uVar7 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  uVar7 = local_50.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar7 < local_50._M_string_length + local_b8) goto LAB_0028ce41;
                puVar10 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_50,0,(char *)0x0,(ulong)local_c0);
              }
              else {
LAB_0028ce41:
                puVar10 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_c0,(ulong)local_50._M_dataplus._M_p);
              }
              psVar11 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_a0.field_2._M_allocated_capacity = *psVar11;
                local_a0.field_2._8_8_ = puVar10[3];
                local_a0._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_a0.field_2._M_allocated_capacity = *psVar11;
                local_a0._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_a0._M_string_length = puVar10[1];
              *puVar10 = psVar11;
              puVar10[1] = 0;
              *(undefined1 *)psVar11 = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_c0 != local_b0) {
                operator_delete(local_c0,local_b0[0] + 1);
              }
              cmMakefile::AddSubDirectory
                        ((this->super_cmCommand).Makefile,inName,&local_a0,
                         (bool)((byte)local_58 & 1),false);
              goto LAB_0028d003;
            }
            local_a0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,"Incorrect SUBDIRS command. Directory: ","");
            local_c0 = local_b0;
            pcVar3 = (inName->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,pcVar3,pcVar3 + inName->_M_string_length);
            std::__cxx11::string::append((char *)&local_c0);
            std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0);
            if (local_c0 != local_b0) {
              operator_delete(local_c0,local_b0[0] + 1);
            }
            cmCommand::SetError(&this->super_cmCommand,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar1) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            local_7c = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
      }
      inName = inName + 1;
    } while (inName != pbVar2);
    bVar5 = (byte)local_7c;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool cmSubdirCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  bool res = true;
  bool excludeFromAll = false;

  for (std::string const& i : args) {
    if (i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (i == "PREORDER") {
      // Ignored
      continue;
    }

    // if they specified a relative path then compute the full
    std::string srcPath =
      this->Makefile->GetCurrentSourceDirectory() + "/" + i;
    if (cmSystemTools::FileIsDirectory(srcPath)) {
      std::string binPath =
        this->Makefile->GetCurrentBinaryDirectory() + "/" + i;
      this->Makefile->AddSubDirectory(srcPath, binPath, excludeFromAll, false);
    }
    // otherwise it is a full path
    else if (cmSystemTools::FileIsDirectory(i)) {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath = this->Makefile->GetCurrentBinaryDirectory() + "/" +
        cmSystemTools::GetFilenameName(i);
      this->Makefile->AddSubDirectory(i, binPath, excludeFromAll, false);
    } else {
      std::string error = "Incorrect SUBDIRS command. Directory: ";
      error += i + " does not exist.";
      this->SetError(error);
      res = false;
    }
  }
  return res;
}